

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O1

void upb_Message_ClearOneof(upb_Message *msg,upb_MiniTable *m,upb_MiniTableField *f)

{
  byte *pbVar1;
  ushort uVar2;
  uint32_t number;
  byte bVar3;
  upb_MiniTableField *puVar4;
  
  if (((ulong)msg->field_0 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x382,
                  "void upb_Message_ClearOneof(struct upb_Message *, const upb_MiniTable *, const upb_MiniTableField *)"
                 );
  }
  if (-1 < f->presence) {
    __assert_fail("upb_MiniTableField_IsInOneof(oneof_field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x79,
                  "uint32_t upb_Message_WhichOneofFieldNumber(const struct upb_Message *, const upb_MiniTableField *)"
                 );
  }
  number = *(uint32_t *)((long)&msg->field_0 + (ulong)(ushort)~f->presence);
  if (number == 0) {
    return;
  }
  puVar4 = upb_MiniTable_FindFieldByNumber(m,number);
  if (((ulong)msg->field_0 & 1) == 0) {
    uVar2 = puVar4->presence;
    if (0 < (short)uVar2) {
      bVar3 = (byte)uVar2 & 7;
      pbVar1 = (byte *)((long)&msg->field_0 + (ulong)(uVar2 >> 3));
      *pbVar1 = *pbVar1 & (-2 << bVar3 | 0xfeU >> 8 - bVar3);
      (*(code *)(&DAT_003a1294 +
                *(int *)(&DAT_003a1294 +
                        (ulong)(puVar4->mode_dont_copy_me__upb_internal_use_only >> 6) * 4)))();
      return;
    }
    if ((short)uVar2 < 0) {
      if (*(uint32_t *)((long)&msg->field_0 + (ulong)(uVar2 ^ 0xffff)) !=
          puVar4->number_dont_copy_me__upb_internal_use_only) {
        return;
      }
      *(undefined4 *)((long)&msg->field_0 + (ulong)(uVar2 ^ 0xffff)) = 0;
    }
    (*(code *)(&DAT_003a1294 +
              *(int *)(&DAT_003a1294 +
                      (ulong)(puVar4->mode_dont_copy_me__upb_internal_use_only >> 6) * 4)))();
    return;
  }
  __assert_fail("!upb_Message_IsFrozen(msg)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x361,
                "void upb_Message_ClearBaseField(struct upb_Message *, const upb_MiniTableField *)")
  ;
}

Assistant:

UPB_API_INLINE void upb_Message_ClearOneof(struct upb_Message* msg,
                                           const upb_MiniTable* m,
                                           const upb_MiniTableField* f) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  uint32_t field_number = upb_Message_WhichOneofFieldNumber(msg, f);
  if (field_number == 0) {
    // No field in the oneof is set.
    return;
  }

  const upb_MiniTableField* field =
      upb_MiniTable_FindFieldByNumber(m, field_number);
  upb_Message_ClearBaseField(msg, field);
}